

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::_get_permute_axes<unsigned_int>
          (CImg<unsigned_int> *__return_storage_ptr__,CImg<unsigned_int> *this,char *permut,
          uint *param_2)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  uint *puVar8;
  CImgArgumentException *this_00;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  ulong uVar12;
  uint local_448;
  uint local_444;
  int x_22;
  int y_22;
  int z_22;
  int c_22;
  unsigned_long whd_22;
  unsigned_long wh_22;
  int x_21;
  int y_21;
  int z_21;
  int c_21;
  unsigned_long whd_21;
  unsigned_long wh_21;
  int x_20;
  int y_20;
  int z_20;
  int c_20;
  unsigned_long whd_20;
  unsigned_long wh_20;
  int x_19;
  int y_19;
  int z_19;
  int c_19;
  unsigned_long whd_19;
  unsigned_long wh_19;
  int x_18;
  int y_18;
  int z_18;
  int c_18;
  unsigned_long whd_18;
  unsigned_long wh_18;
  int x_17;
  int y_17;
  int z_17;
  int c_17;
  unsigned_long whd_17;
  unsigned_long wh_17;
  unsigned_long siz_7;
  uint *ptrd_3;
  uint *ptr_a_1;
  uint *ptr_b_3;
  uint *ptr_g_5;
  uint *ptr_r_7;
  unsigned_long siz_6;
  uint *ptrd_2;
  uint *ptr_b_2;
  uint *ptr_g_4;
  uint *ptr_r_6;
  unsigned_long siz_5;
  uint *ptrd_1;
  uint *ptr_g_3;
  uint *ptr_r_5;
  unsigned_long siz_4;
  uint *ptrd;
  uint *ptr_r_4;
  int x_16;
  int y_16;
  int z_16;
  int c_16;
  unsigned_long whd_16;
  unsigned_long wh_16;
  int x_15;
  int y_15;
  int z_15;
  int c_15;
  unsigned_long whd_15;
  unsigned_long wh_15;
  int x_14;
  int y_14;
  int z_14;
  int c_14;
  unsigned_long whd_14;
  unsigned_long wh_14;
  int x_13;
  int y_13;
  int z_13;
  int c_13;
  unsigned_long whd_13;
  unsigned_long wh_13;
  int x_12;
  int y_12;
  int z_12;
  int c_12;
  unsigned_long whd_12;
  unsigned_long wh_12;
  int x_11;
  int y_11;
  int z_11;
  int c_11;
  unsigned_long whd_11;
  unsigned_long wh_11;
  int x_10;
  int y_10;
  int z_10;
  int c_10;
  unsigned_long whd_10;
  unsigned_long wh_10;
  int x_9;
  int y_9;
  int z_9;
  int c_9;
  unsigned_long whd_9;
  unsigned_long wh_9;
  int x_8;
  int y_8;
  int z_8;
  int c_8;
  unsigned_long whd_8;
  unsigned_long wh_8;
  uint *puStack_1d0;
  uint siz_3;
  uint *ptr_a;
  uint *ptr_b_1;
  uint *ptr_g_2;
  uint *ptr_r_3;
  uint *puStack_1a8;
  uint siz_2;
  uint *ptr_b;
  uint *ptr_g_1;
  uint *ptr_r_2;
  uint *puStack_188;
  uint siz_1;
  uint *ptr_g;
  uint *ptr_r_1;
  uint *puStack_170;
  uint siz;
  uint *ptr_r;
  int x_7;
  int y_7;
  int z_7;
  int c_7;
  unsigned_long whd_7;
  unsigned_long wh_7;
  int x_6;
  int y_6;
  int z_6;
  int c_6;
  unsigned_long whd_6;
  unsigned_long wh_6;
  int x_5;
  int y_5;
  int z_5;
  int c_5;
  unsigned_long whd_5;
  unsigned_long wh_5;
  int x_4;
  int y_4;
  int z_4;
  int c_4;
  unsigned_long whd_4;
  unsigned_long wh_4;
  int x_3;
  int y_3;
  int z_3;
  int c_3;
  unsigned_long whd_3;
  unsigned_long wh_3;
  int x_2;
  int y_2;
  int z_2;
  int c_2;
  unsigned_long whd_2;
  unsigned_long wh_2;
  int x_1;
  int y_1;
  int z_1;
  int c_1;
  unsigned_long whd_1;
  unsigned_long wh_1;
  int x;
  int y;
  int z;
  int c;
  unsigned_long whd;
  unsigned_long wh;
  uint *local_58;
  uint *ptrs;
  CImg<unsigned_int> res;
  uint *param_2_local;
  char *permut_local;
  CImg<unsigned_int> *this_local;
  
  res._data = param_2;
  bVar5 = is_empty(this);
  if ((bVar5) || (permut == (char *)0x0)) {
    CImg(__return_storage_ptr__,this,false);
    return __return_storage_ptr__;
  }
  CImg((CImg<unsigned_int> *)&ptrs);
  local_58 = this->_data;
  iVar6 = cimg::strncasecmp(permut,"xyzc",4);
  if (iVar6 == 0) {
    operator+(__return_storage_ptr__,this);
  }
  else {
    iVar6 = cimg::strncasecmp(permut,"xycz",4);
    if (iVar6 == 0) {
      assign((CImg<unsigned_int> *)&ptrs,this->_width,this->_height,this->_spectrum,this->_depth);
      uVar7 = (ulong)(uint)ptrs;
      uVar11 = (ulong)ptrs._4_4_;
      uVar12 = (ulong)res._width;
      for (y = 0; y < (int)this->_spectrum; y = y + 1) {
        for (x = 0; x < (int)this->_depth; x = x + 1) {
          for (wh_1._4_4_ = 0; (int)wh_1._4_4_ < (int)this->_height; wh_1._4_4_ = wh_1._4_4_ + 1) {
            for (wh_1._0_4_ = 0; (int)(uint)wh_1 < (int)this->_width; wh_1._0_4_ = (uint)wh_1 + 1) {
              uVar1 = *local_58;
              puVar8 = operator()((CImg<unsigned_int> *)&ptrs,(uint)wh_1,wh_1._4_4_,y,x,
                                  uVar7 * uVar11,uVar7 * uVar11 * uVar12);
              *puVar8 = uVar1;
              local_58 = local_58 + 1;
            }
          }
        }
      }
    }
    iVar6 = cimg::strncasecmp(permut,"xzyc",4);
    if (iVar6 == 0) {
      assign((CImg<unsigned_int> *)&ptrs,this->_width,this->_depth,this->_height,this->_spectrum);
      uVar7 = (ulong)(uint)ptrs;
      uVar11 = (ulong)ptrs._4_4_;
      uVar12 = (ulong)res._width;
      for (y_1 = 0; y_1 < (int)this->_spectrum; y_1 = y_1 + 1) {
        for (x_1 = 0; x_1 < (int)this->_depth; x_1 = x_1 + 1) {
          for (wh_2._4_4_ = 0; (int)wh_2._4_4_ < (int)this->_height; wh_2._4_4_ = wh_2._4_4_ + 1) {
            for (wh_2._0_4_ = 0; (int)(uint)wh_2 < (int)this->_width; wh_2._0_4_ = (uint)wh_2 + 1) {
              uVar1 = *local_58;
              puVar8 = operator()((CImg<unsigned_int> *)&ptrs,(uint)wh_2,x_1,wh_2._4_4_,y_1,
                                  uVar7 * uVar11,uVar7 * uVar11 * uVar12);
              *puVar8 = uVar1;
              local_58 = local_58 + 1;
            }
          }
        }
      }
    }
    iVar6 = cimg::strncasecmp(permut,"xzcy",4);
    if (iVar6 == 0) {
      assign((CImg<unsigned_int> *)&ptrs,this->_width,this->_depth,this->_spectrum,this->_height);
      uVar7 = (ulong)(uint)ptrs;
      uVar11 = (ulong)ptrs._4_4_;
      uVar12 = (ulong)res._width;
      for (y_2 = 0; y_2 < (int)this->_spectrum; y_2 = y_2 + 1) {
        for (x_2 = 0; x_2 < (int)this->_depth; x_2 = x_2 + 1) {
          for (wh_3._4_4_ = 0; (int)wh_3._4_4_ < (int)this->_height; wh_3._4_4_ = wh_3._4_4_ + 1) {
            for (wh_3._0_4_ = 0; (int)(uint)wh_3 < (int)this->_width; wh_3._0_4_ = (uint)wh_3 + 1) {
              uVar1 = *local_58;
              puVar8 = operator()((CImg<unsigned_int> *)&ptrs,(uint)wh_3,x_2,y_2,wh_3._4_4_,
                                  uVar7 * uVar11,uVar7 * uVar11 * uVar12);
              *puVar8 = uVar1;
              local_58 = local_58 + 1;
            }
          }
        }
      }
    }
    iVar6 = cimg::strncasecmp(permut,"xcyz",4);
    if (iVar6 == 0) {
      assign((CImg<unsigned_int> *)&ptrs,this->_width,this->_spectrum,this->_height,this->_depth);
      uVar7 = (ulong)(uint)ptrs;
      uVar11 = (ulong)ptrs._4_4_;
      uVar12 = (ulong)res._width;
      for (y_3 = 0; y_3 < (int)this->_spectrum; y_3 = y_3 + 1) {
        for (x_3 = 0; x_3 < (int)this->_depth; x_3 = x_3 + 1) {
          for (wh_4._4_4_ = 0; (int)wh_4._4_4_ < (int)this->_height; wh_4._4_4_ = wh_4._4_4_ + 1) {
            for (wh_4._0_4_ = 0; (int)(uint)wh_4 < (int)this->_width; wh_4._0_4_ = (uint)wh_4 + 1) {
              uVar1 = *local_58;
              puVar8 = operator()((CImg<unsigned_int> *)&ptrs,(uint)wh_4,y_3,wh_4._4_4_,x_3,
                                  uVar7 * uVar11,uVar7 * uVar11 * uVar12);
              *puVar8 = uVar1;
              local_58 = local_58 + 1;
            }
          }
        }
      }
    }
    iVar6 = cimg::strncasecmp(permut,"xczy",4);
    if (iVar6 == 0) {
      assign((CImg<unsigned_int> *)&ptrs,this->_width,this->_spectrum,this->_depth,this->_height);
      uVar7 = (ulong)(uint)ptrs;
      uVar11 = (ulong)ptrs._4_4_;
      uVar12 = (ulong)res._width;
      for (y_4 = 0; y_4 < (int)this->_spectrum; y_4 = y_4 + 1) {
        for (x_4 = 0; x_4 < (int)this->_depth; x_4 = x_4 + 1) {
          for (wh_5._4_4_ = 0; (int)wh_5._4_4_ < (int)this->_height; wh_5._4_4_ = wh_5._4_4_ + 1) {
            for (wh_5._0_4_ = 0; (int)(uint)wh_5 < (int)this->_width; wh_5._0_4_ = (uint)wh_5 + 1) {
              uVar1 = *local_58;
              puVar8 = operator()((CImg<unsigned_int> *)&ptrs,(uint)wh_5,y_4,x_4,wh_5._4_4_,
                                  uVar7 * uVar11,uVar7 * uVar11 * uVar12);
              *puVar8 = uVar1;
              local_58 = local_58 + 1;
            }
          }
        }
      }
    }
    iVar6 = cimg::strncasecmp(permut,"yxzc",4);
    if (iVar6 == 0) {
      assign((CImg<unsigned_int> *)&ptrs,this->_height,this->_width,this->_depth,this->_spectrum);
      uVar7 = (ulong)(uint)ptrs;
      uVar11 = (ulong)ptrs._4_4_;
      uVar12 = (ulong)res._width;
      for (y_5 = 0; y_5 < (int)this->_spectrum; y_5 = y_5 + 1) {
        for (x_5 = 0; x_5 < (int)this->_depth; x_5 = x_5 + 1) {
          for (wh_6._4_4_ = 0; (int)wh_6._4_4_ < (int)this->_height; wh_6._4_4_ = wh_6._4_4_ + 1) {
            for (wh_6._0_4_ = 0; (int)(uint)wh_6 < (int)this->_width; wh_6._0_4_ = (uint)wh_6 + 1) {
              uVar1 = *local_58;
              puVar8 = operator()((CImg<unsigned_int> *)&ptrs,wh_6._4_4_,(uint)wh_6,x_5,y_5,
                                  uVar7 * uVar11,uVar7 * uVar11 * uVar12);
              *puVar8 = uVar1;
              local_58 = local_58 + 1;
            }
          }
        }
      }
    }
    iVar6 = cimg::strncasecmp(permut,"yxcz",4);
    if (iVar6 == 0) {
      assign((CImg<unsigned_int> *)&ptrs,this->_height,this->_width,this->_spectrum,this->_depth);
      uVar7 = (ulong)(uint)ptrs;
      uVar11 = (ulong)ptrs._4_4_;
      uVar12 = (ulong)res._width;
      for (y_6 = 0; y_6 < (int)this->_spectrum; y_6 = y_6 + 1) {
        for (x_6 = 0; x_6 < (int)this->_depth; x_6 = x_6 + 1) {
          for (wh_7._4_4_ = 0; (int)wh_7._4_4_ < (int)this->_height; wh_7._4_4_ = wh_7._4_4_ + 1) {
            for (wh_7._0_4_ = 0; (int)(uint)wh_7 < (int)this->_width; wh_7._0_4_ = (uint)wh_7 + 1) {
              uVar1 = *local_58;
              puVar8 = operator()((CImg<unsigned_int> *)&ptrs,wh_7._4_4_,(uint)wh_7,y_6,x_6,
                                  uVar7 * uVar11,uVar7 * uVar11 * uVar12);
              *puVar8 = uVar1;
              local_58 = local_58 + 1;
            }
          }
        }
      }
    }
    iVar6 = cimg::strncasecmp(permut,"yzxc",4);
    if (iVar6 == 0) {
      assign((CImg<unsigned_int> *)&ptrs,this->_height,this->_depth,this->_width,this->_spectrum);
      uVar7 = (ulong)(uint)ptrs;
      uVar11 = (ulong)ptrs._4_4_;
      uVar12 = (ulong)res._width;
      for (y_7 = 0; y_7 < (int)this->_spectrum; y_7 = y_7 + 1) {
        for (x_7 = 0; x_7 < (int)this->_depth; x_7 = x_7 + 1) {
          for (ptr_r._4_4_ = 0; (int)ptr_r._4_4_ < (int)this->_height; ptr_r._4_4_ = ptr_r._4_4_ + 1
              ) {
            for (ptr_r._0_4_ = 0; (int)(uint)ptr_r < (int)this->_width;
                ptr_r._0_4_ = (uint)ptr_r + 1) {
              uVar1 = *local_58;
              puVar8 = operator()((CImg<unsigned_int> *)&ptrs,ptr_r._4_4_,x_7,(uint)ptr_r,y_7,
                                  uVar7 * uVar11,uVar7 * uVar11 * uVar12);
              *puVar8 = uVar1;
              local_58 = local_58 + 1;
            }
          }
        }
      }
    }
    iVar6 = cimg::strncasecmp(permut,"yzcx",4);
    if (iVar6 == 0) {
      assign((CImg<unsigned_int> *)&ptrs,this->_height,this->_depth,this->_spectrum,this->_width);
      switch(this->_width) {
      case 1:
        puStack_170 = data((CImg<unsigned_int> *)&ptrs,0,0,0,0);
        for (ptr_r_1._4_4_ = this->_height * this->_depth * this->_spectrum; ptr_r_1._4_4_ != 0;
            ptr_r_1._4_4_ = ptr_r_1._4_4_ + -1) {
          *puStack_170 = *local_58;
          puStack_170 = puStack_170 + 1;
          local_58 = local_58 + 1;
        }
        break;
      case 2:
        ptr_g = data((CImg<unsigned_int> *)&ptrs,0,0,0,0);
        puStack_188 = data((CImg<unsigned_int> *)&ptrs,0,0,0,1);
        for (ptr_r_2._4_4_ = this->_height * this->_depth * this->_spectrum; ptr_r_2._4_4_ != 0;
            ptr_r_2._4_4_ = ptr_r_2._4_4_ + -1) {
          puVar8 = local_58 + 1;
          *ptr_g = *local_58;
          local_58 = local_58 + 2;
          *puStack_188 = *puVar8;
          puStack_188 = puStack_188 + 1;
          ptr_g = ptr_g + 1;
        }
        break;
      case 3:
        ptr_g_1 = data((CImg<unsigned_int> *)&ptrs,0,0,0,0);
        ptr_b = data((CImg<unsigned_int> *)&ptrs,0,0,0,1);
        puStack_1a8 = data((CImg<unsigned_int> *)&ptrs,0,0,0,2);
        for (ptr_r_3._4_4_ = this->_height * this->_depth * this->_spectrum; ptr_r_3._4_4_ != 0;
            ptr_r_3._4_4_ = ptr_r_3._4_4_ + -1) {
          *ptr_g_1 = *local_58;
          puVar8 = local_58 + 2;
          *ptr_b = local_58[1];
          local_58 = local_58 + 3;
          *puStack_1a8 = *puVar8;
          puStack_1a8 = puStack_1a8 + 1;
          ptr_b = ptr_b + 1;
          ptr_g_1 = ptr_g_1 + 1;
        }
        break;
      case 4:
        ptr_g_2 = data((CImg<unsigned_int> *)&ptrs,0,0,0,0);
        ptr_b_1 = data((CImg<unsigned_int> *)&ptrs,0,0,0,1);
        ptr_a = data((CImg<unsigned_int> *)&ptrs,0,0,0,2);
        puStack_1d0 = data((CImg<unsigned_int> *)&ptrs,0,0,0,3);
        for (wh_8._4_4_ = this->_height * this->_depth * this->_spectrum; wh_8._4_4_ != 0;
            wh_8._4_4_ = wh_8._4_4_ + -1) {
          *ptr_g_2 = *local_58;
          *ptr_b_1 = local_58[1];
          puVar8 = local_58 + 3;
          *ptr_a = local_58[2];
          local_58 = local_58 + 4;
          *puStack_1d0 = *puVar8;
          puStack_1d0 = puStack_1d0 + 1;
          ptr_a = ptr_a + 1;
          ptr_b_1 = ptr_b_1 + 1;
          ptr_g_2 = ptr_g_2 + 1;
        }
        break;
      default:
        for (y_8 = 0; y_8 < (int)this->_spectrum; y_8 = y_8 + 1) {
          for (x_8 = 0; x_8 < (int)this->_depth; x_8 = x_8 + 1) {
            for (wh_9._4_4_ = 0; (int)wh_9._4_4_ < (int)this->_height; wh_9._4_4_ = wh_9._4_4_ + 1)
            {
              for (wh_9._0_4_ = 0; (int)(uint)wh_9 < (int)this->_width; wh_9._0_4_ = (uint)wh_9 + 1)
              {
                uVar1 = *local_58;
                puVar8 = operator()((CImg<unsigned_int> *)&ptrs,wh_9._4_4_,x_8,y_8,(uint)wh_9,
                                    (ulong)(uint)ptrs * (ulong)ptrs._4_4_,
                                    (ulong)(uint)ptrs * (ulong)ptrs._4_4_ * (ulong)res._width);
                *puVar8 = uVar1;
                local_58 = local_58 + 1;
              }
            }
          }
        }
        CImg(__return_storage_ptr__,(CImg<unsigned_int> *)&ptrs);
        goto LAB_0014ec4d;
      }
    }
    iVar6 = cimg::strncasecmp(permut,"ycxz",4);
    if (iVar6 == 0) {
      assign((CImg<unsigned_int> *)&ptrs,this->_height,this->_spectrum,this->_width,this->_depth);
      uVar7 = (ulong)(uint)ptrs;
      uVar11 = (ulong)ptrs._4_4_;
      uVar12 = (ulong)res._width;
      for (y_9 = 0; y_9 < (int)this->_spectrum; y_9 = y_9 + 1) {
        for (x_9 = 0; x_9 < (int)this->_depth; x_9 = x_9 + 1) {
          for (wh_10._4_4_ = 0; (int)wh_10._4_4_ < (int)this->_height; wh_10._4_4_ = wh_10._4_4_ + 1
              ) {
            for (wh_10._0_4_ = 0; (int)(uint)wh_10 < (int)this->_width;
                wh_10._0_4_ = (uint)wh_10 + 1) {
              uVar1 = *local_58;
              puVar8 = operator()((CImg<unsigned_int> *)&ptrs,wh_10._4_4_,y_9,(uint)wh_10,x_9,
                                  uVar7 * uVar11,uVar7 * uVar11 * uVar12);
              *puVar8 = uVar1;
              local_58 = local_58 + 1;
            }
          }
        }
      }
    }
    iVar6 = cimg::strncasecmp(permut,"yczx",4);
    if (iVar6 == 0) {
      assign((CImg<unsigned_int> *)&ptrs,this->_height,this->_spectrum,this->_depth,this->_width);
      uVar7 = (ulong)(uint)ptrs;
      uVar11 = (ulong)ptrs._4_4_;
      uVar12 = (ulong)res._width;
      for (y_10 = 0; y_10 < (int)this->_spectrum; y_10 = y_10 + 1) {
        for (x_10 = 0; x_10 < (int)this->_depth; x_10 = x_10 + 1) {
          for (wh_11._4_4_ = 0; (int)wh_11._4_4_ < (int)this->_height; wh_11._4_4_ = wh_11._4_4_ + 1
              ) {
            for (wh_11._0_4_ = 0; (int)(uint)wh_11 < (int)this->_width;
                wh_11._0_4_ = (uint)wh_11 + 1) {
              uVar1 = *local_58;
              puVar8 = operator()((CImg<unsigned_int> *)&ptrs,wh_11._4_4_,y_10,x_10,(uint)wh_11,
                                  uVar7 * uVar11,uVar7 * uVar11 * uVar12);
              *puVar8 = uVar1;
              local_58 = local_58 + 1;
            }
          }
        }
      }
    }
    iVar6 = cimg::strncasecmp(permut,"zxyc",4);
    if (iVar6 == 0) {
      assign((CImg<unsigned_int> *)&ptrs,this->_depth,this->_width,this->_height,this->_spectrum);
      uVar7 = (ulong)(uint)ptrs;
      uVar11 = (ulong)ptrs._4_4_;
      uVar12 = (ulong)res._width;
      for (y_11 = 0; y_11 < (int)this->_spectrum; y_11 = y_11 + 1) {
        for (x_11 = 0; x_11 < (int)this->_depth; x_11 = x_11 + 1) {
          for (wh_12._4_4_ = 0; (int)wh_12._4_4_ < (int)this->_height; wh_12._4_4_ = wh_12._4_4_ + 1
              ) {
            for (wh_12._0_4_ = 0; (int)(uint)wh_12 < (int)this->_width;
                wh_12._0_4_ = (uint)wh_12 + 1) {
              uVar1 = *local_58;
              puVar8 = operator()((CImg<unsigned_int> *)&ptrs,x_11,(uint)wh_12,wh_12._4_4_,y_11,
                                  uVar7 * uVar11,uVar7 * uVar11 * uVar12);
              *puVar8 = uVar1;
              local_58 = local_58 + 1;
            }
          }
        }
      }
    }
    iVar6 = cimg::strncasecmp(permut,"zxcy",4);
    if (iVar6 == 0) {
      assign((CImg<unsigned_int> *)&ptrs,this->_depth,this->_width,this->_spectrum,this->_height);
      uVar7 = (ulong)(uint)ptrs;
      uVar11 = (ulong)ptrs._4_4_;
      uVar12 = (ulong)res._width;
      for (y_12 = 0; y_12 < (int)this->_spectrum; y_12 = y_12 + 1) {
        for (x_12 = 0; x_12 < (int)this->_depth; x_12 = x_12 + 1) {
          for (wh_13._4_4_ = 0; (int)wh_13._4_4_ < (int)this->_height; wh_13._4_4_ = wh_13._4_4_ + 1
              ) {
            for (wh_13._0_4_ = 0; (int)(uint)wh_13 < (int)this->_width;
                wh_13._0_4_ = (uint)wh_13 + 1) {
              uVar1 = *local_58;
              puVar8 = operator()((CImg<unsigned_int> *)&ptrs,x_12,(uint)wh_13,y_12,wh_13._4_4_,
                                  uVar7 * uVar11,uVar7 * uVar11 * uVar12);
              *puVar8 = uVar1;
              local_58 = local_58 + 1;
            }
          }
        }
      }
    }
    iVar6 = cimg::strncasecmp(permut,"zyxc",4);
    if (iVar6 == 0) {
      assign((CImg<unsigned_int> *)&ptrs,this->_depth,this->_height,this->_width,this->_spectrum);
      uVar7 = (ulong)(uint)ptrs;
      uVar11 = (ulong)ptrs._4_4_;
      uVar12 = (ulong)res._width;
      for (y_13 = 0; y_13 < (int)this->_spectrum; y_13 = y_13 + 1) {
        for (x_13 = 0; x_13 < (int)this->_depth; x_13 = x_13 + 1) {
          for (wh_14._4_4_ = 0; (int)wh_14._4_4_ < (int)this->_height; wh_14._4_4_ = wh_14._4_4_ + 1
              ) {
            for (wh_14._0_4_ = 0; (int)(uint)wh_14 < (int)this->_width;
                wh_14._0_4_ = (uint)wh_14 + 1) {
              uVar1 = *local_58;
              puVar8 = operator()((CImg<unsigned_int> *)&ptrs,x_13,wh_14._4_4_,(uint)wh_14,y_13,
                                  uVar7 * uVar11,uVar7 * uVar11 * uVar12);
              *puVar8 = uVar1;
              local_58 = local_58 + 1;
            }
          }
        }
      }
    }
    iVar6 = cimg::strncasecmp(permut,"zycx",4);
    if (iVar6 == 0) {
      assign((CImg<unsigned_int> *)&ptrs,this->_depth,this->_height,this->_spectrum,this->_width);
      uVar7 = (ulong)(uint)ptrs;
      uVar11 = (ulong)ptrs._4_4_;
      uVar12 = (ulong)res._width;
      for (y_14 = 0; y_14 < (int)this->_spectrum; y_14 = y_14 + 1) {
        for (x_14 = 0; x_14 < (int)this->_depth; x_14 = x_14 + 1) {
          for (wh_15._4_4_ = 0; (int)wh_15._4_4_ < (int)this->_height; wh_15._4_4_ = wh_15._4_4_ + 1
              ) {
            for (wh_15._0_4_ = 0; (int)(uint)wh_15 < (int)this->_width;
                wh_15._0_4_ = (uint)wh_15 + 1) {
              uVar1 = *local_58;
              puVar8 = operator()((CImg<unsigned_int> *)&ptrs,x_14,wh_15._4_4_,y_14,(uint)wh_15,
                                  uVar7 * uVar11,uVar7 * uVar11 * uVar12);
              *puVar8 = uVar1;
              local_58 = local_58 + 1;
            }
          }
        }
      }
    }
    iVar6 = cimg::strncasecmp(permut,"zcxy",4);
    if (iVar6 == 0) {
      assign((CImg<unsigned_int> *)&ptrs,this->_depth,this->_spectrum,this->_width,this->_height);
      uVar7 = (ulong)(uint)ptrs;
      uVar11 = (ulong)ptrs._4_4_;
      uVar12 = (ulong)res._width;
      for (y_15 = 0; y_15 < (int)this->_spectrum; y_15 = y_15 + 1) {
        for (x_15 = 0; x_15 < (int)this->_depth; x_15 = x_15 + 1) {
          for (wh_16._4_4_ = 0; (int)wh_16._4_4_ < (int)this->_height; wh_16._4_4_ = wh_16._4_4_ + 1
              ) {
            for (wh_16._0_4_ = 0; (int)(uint)wh_16 < (int)this->_width;
                wh_16._0_4_ = (uint)wh_16 + 1) {
              uVar1 = *local_58;
              puVar8 = operator()((CImg<unsigned_int> *)&ptrs,x_15,y_15,(uint)wh_16,wh_16._4_4_,
                                  uVar7 * uVar11,uVar7 * uVar11 * uVar12);
              *puVar8 = uVar1;
              local_58 = local_58 + 1;
            }
          }
        }
      }
    }
    iVar6 = cimg::strncasecmp(permut,"zcyx",4);
    if (iVar6 == 0) {
      assign((CImg<unsigned_int> *)&ptrs,this->_depth,this->_spectrum,this->_height,this->_width);
      uVar7 = (ulong)(uint)ptrs;
      uVar11 = (ulong)ptrs._4_4_;
      uVar12 = (ulong)res._width;
      for (y_16 = 0; y_16 < (int)this->_spectrum; y_16 = y_16 + 1) {
        for (x_16 = 0; x_16 < (int)this->_depth; x_16 = x_16 + 1) {
          for (ptr_r_4._4_4_ = 0; (int)ptr_r_4._4_4_ < (int)this->_height;
              ptr_r_4._4_4_ = ptr_r_4._4_4_ + 1) {
            for (ptr_r_4._0_4_ = 0; (int)(uint)ptr_r_4 < (int)this->_width;
                ptr_r_4._0_4_ = (uint)ptr_r_4 + 1) {
              uVar1 = *local_58;
              puVar8 = operator()((CImg<unsigned_int> *)&ptrs,x_16,y_16,ptr_r_4._4_4_,(uint)ptr_r_4,
                                  uVar7 * uVar11,uVar7 * uVar11 * uVar12);
              *puVar8 = uVar1;
              local_58 = local_58 + 1;
            }
          }
        }
      }
    }
    iVar6 = cimg::strncasecmp(permut,"cxyz",4);
    if (iVar6 == 0) {
      assign((CImg<unsigned_int> *)&ptrs,this->_spectrum,this->_width,this->_height,this->_depth);
      switch(this->_spectrum) {
      case 1:
        ptrd = data(this,0,0,0,0);
        siz_4 = res._16_8_;
        for (ptr_r_5 = (uint *)((ulong)this->_width * (ulong)this->_height * (ulong)this->_depth);
            ptr_r_5 != (uint *)0x0; ptr_r_5 = (uint *)((long)ptr_r_5 + -1)) {
          *(uint *)siz_4 = *ptrd;
          siz_4 = siz_4 + 4;
          ptrd = ptrd + 1;
        }
        break;
      case 2:
        ptr_g_3 = data(this,0,0,0,0);
        ptrd_1 = data(this,0,0,0,1);
        siz_5 = res._16_8_;
        for (ptr_r_6 = (uint *)((ulong)this->_width * (ulong)this->_height * (ulong)this->_depth);
            ptr_r_6 != (uint *)0x0; ptr_r_6 = (uint *)((long)ptr_r_6 + -1)) {
          puVar8 = (uint *)(siz_5 + 4);
          *(uint *)siz_5 = *ptr_g_3;
          siz_5 = siz_5 + 8;
          *puVar8 = *ptrd_1;
          ptrd_1 = ptrd_1 + 1;
          ptr_g_3 = ptr_g_3 + 1;
        }
        break;
      case 3:
        ptr_g_4 = data(this,0,0,0,0);
        ptr_b_2 = data(this,0,0,0,1);
        ptrd_2 = data(this,0,0,0,2);
        siz_6 = res._16_8_;
        for (ptr_r_7 = (uint *)((ulong)this->_width * (ulong)this->_height * (ulong)this->_depth);
            ptr_r_7 != (uint *)0x0; ptr_r_7 = (uint *)((long)ptr_r_7 + -1)) {
          *(uint *)siz_6 = *ptr_g_4;
          puVar8 = (uint *)(siz_6 + 8);
          *(uint *)(siz_6 + 4) = *ptr_b_2;
          siz_6 = siz_6 + 0xc;
          *puVar8 = *ptrd_2;
          ptrd_2 = ptrd_2 + 1;
          ptr_b_2 = ptr_b_2 + 1;
          ptr_g_4 = ptr_g_4 + 1;
        }
        break;
      case 4:
        ptr_g_5 = data(this,0,0,0,0);
        ptr_b_3 = data(this,0,0,0,1);
        ptr_a_1 = data(this,0,0,0,2);
        ptrd_3 = data(this,0,0,0,3);
        siz_7 = res._16_8_;
        for (wh_17 = (ulong)this->_width * (ulong)this->_height * (ulong)this->_depth; wh_17 != 0;
            wh_17 = wh_17 - 1) {
          *(uint *)siz_7 = *ptr_g_5;
          *(uint *)(siz_7 + 4) = *ptr_b_3;
          puVar8 = (uint *)(siz_7 + 0xc);
          *(uint *)(siz_7 + 8) = *ptr_a_1;
          siz_7 = siz_7 + 0x10;
          *puVar8 = *ptrd_3;
          ptrd_3 = ptrd_3 + 1;
          ptr_a_1 = ptr_a_1 + 1;
          ptr_b_3 = ptr_b_3 + 1;
          ptr_g_5 = ptr_g_5 + 1;
        }
        break;
      default:
        uVar7 = (ulong)(uint)ptrs;
        uVar11 = (ulong)ptrs._4_4_;
        uVar12 = (ulong)res._width;
        for (y_17 = 0; y_17 < (int)this->_spectrum; y_17 = y_17 + 1) {
          for (x_17 = 0; x_17 < (int)this->_depth; x_17 = x_17 + 1) {
            for (wh_18._4_4_ = 0; (int)wh_18._4_4_ < (int)this->_height;
                wh_18._4_4_ = wh_18._4_4_ + 1) {
              for (wh_18._0_4_ = 0; (int)(uint)wh_18 < (int)this->_width;
                  wh_18._0_4_ = (uint)wh_18 + 1) {
                uVar1 = *local_58;
                puVar8 = operator()((CImg<unsigned_int> *)&ptrs,y_17,(uint)wh_18,wh_18._4_4_,x_17,
                                    uVar7 * uVar11,uVar7 * uVar11 * uVar12);
                *puVar8 = uVar1;
                local_58 = local_58 + 1;
              }
            }
          }
        }
      }
    }
    iVar6 = cimg::strncasecmp(permut,"cxzy",4);
    if (iVar6 == 0) {
      assign((CImg<unsigned_int> *)&ptrs,this->_spectrum,this->_width,this->_depth,this->_height);
      uVar7 = (ulong)(uint)ptrs;
      uVar11 = (ulong)ptrs._4_4_;
      uVar12 = (ulong)res._width;
      for (y_18 = 0; y_18 < (int)this->_spectrum; y_18 = y_18 + 1) {
        for (x_18 = 0; x_18 < (int)this->_depth; x_18 = x_18 + 1) {
          for (wh_19._4_4_ = 0; (int)wh_19._4_4_ < (int)this->_height; wh_19._4_4_ = wh_19._4_4_ + 1
              ) {
            for (wh_19._0_4_ = 0; (int)(uint)wh_19 < (int)this->_width;
                wh_19._0_4_ = (uint)wh_19 + 1) {
              uVar1 = *local_58;
              puVar8 = operator()((CImg<unsigned_int> *)&ptrs,y_18,(uint)wh_19,x_18,wh_19._4_4_,
                                  uVar7 * uVar11,uVar7 * uVar11 * uVar12);
              *puVar8 = uVar1;
              local_58 = local_58 + 1;
            }
          }
        }
      }
    }
    iVar6 = cimg::strncasecmp(permut,"cyxz",4);
    if (iVar6 == 0) {
      assign((CImg<unsigned_int> *)&ptrs,this->_spectrum,this->_height,this->_width,this->_depth);
      uVar7 = (ulong)(uint)ptrs;
      uVar11 = (ulong)ptrs._4_4_;
      uVar12 = (ulong)res._width;
      for (y_19 = 0; y_19 < (int)this->_spectrum; y_19 = y_19 + 1) {
        for (x_19 = 0; x_19 < (int)this->_depth; x_19 = x_19 + 1) {
          for (wh_20._4_4_ = 0; (int)wh_20._4_4_ < (int)this->_height; wh_20._4_4_ = wh_20._4_4_ + 1
              ) {
            for (wh_20._0_4_ = 0; (int)(uint)wh_20 < (int)this->_width;
                wh_20._0_4_ = (uint)wh_20 + 1) {
              uVar1 = *local_58;
              puVar8 = operator()((CImg<unsigned_int> *)&ptrs,y_19,wh_20._4_4_,(uint)wh_20,x_19,
                                  uVar7 * uVar11,uVar7 * uVar11 * uVar12);
              *puVar8 = uVar1;
              local_58 = local_58 + 1;
            }
          }
        }
      }
    }
    iVar6 = cimg::strncasecmp(permut,"cyzx",4);
    if (iVar6 == 0) {
      assign((CImg<unsigned_int> *)&ptrs,this->_spectrum,this->_height,this->_depth,this->_width);
      uVar7 = (ulong)(uint)ptrs;
      uVar11 = (ulong)ptrs._4_4_;
      uVar12 = (ulong)res._width;
      for (y_20 = 0; y_20 < (int)this->_spectrum; y_20 = y_20 + 1) {
        for (x_20 = 0; x_20 < (int)this->_depth; x_20 = x_20 + 1) {
          for (wh_21._4_4_ = 0; (int)wh_21._4_4_ < (int)this->_height; wh_21._4_4_ = wh_21._4_4_ + 1
              ) {
            for (wh_21._0_4_ = 0; (int)(uint)wh_21 < (int)this->_width;
                wh_21._0_4_ = (uint)wh_21 + 1) {
              uVar1 = *local_58;
              puVar8 = operator()((CImg<unsigned_int> *)&ptrs,y_20,wh_21._4_4_,x_20,(uint)wh_21,
                                  uVar7 * uVar11,uVar7 * uVar11 * uVar12);
              *puVar8 = uVar1;
              local_58 = local_58 + 1;
            }
          }
        }
      }
    }
    iVar6 = cimg::strncasecmp(permut,"czxy",4);
    if (iVar6 == 0) {
      assign((CImg<unsigned_int> *)&ptrs,this->_spectrum,this->_depth,this->_width,this->_height);
      uVar7 = (ulong)(uint)ptrs;
      uVar11 = (ulong)ptrs._4_4_;
      uVar12 = (ulong)res._width;
      for (y_21 = 0; y_21 < (int)this->_spectrum; y_21 = y_21 + 1) {
        for (x_21 = 0; x_21 < (int)this->_depth; x_21 = x_21 + 1) {
          for (wh_22._4_4_ = 0; (int)wh_22._4_4_ < (int)this->_height; wh_22._4_4_ = wh_22._4_4_ + 1
              ) {
            for (wh_22._0_4_ = 0; (int)(uint)wh_22 < (int)this->_width;
                wh_22._0_4_ = (uint)wh_22 + 1) {
              uVar1 = *local_58;
              puVar8 = operator()((CImg<unsigned_int> *)&ptrs,y_21,x_21,(uint)wh_22,wh_22._4_4_,
                                  uVar7 * uVar11,uVar7 * uVar11 * uVar12);
              *puVar8 = uVar1;
              local_58 = local_58 + 1;
            }
          }
        }
      }
    }
    iVar6 = cimg::strncasecmp(permut,"czyx",4);
    if (iVar6 == 0) {
      assign((CImg<unsigned_int> *)&ptrs,this->_spectrum,this->_depth,this->_height,this->_width);
      for (y_22 = 0; y_22 < (int)this->_spectrum; y_22 = y_22 + 1) {
        for (x_22 = 0; x_22 < (int)this->_depth; x_22 = x_22 + 1) {
          for (local_444 = 0; (int)local_444 < (int)this->_height; local_444 = local_444 + 1) {
            for (local_448 = 0; (int)local_448 < (int)this->_width; local_448 = local_448 + 1) {
              uVar1 = *local_58;
              puVar8 = operator()((CImg<unsigned_int> *)&ptrs,y_22,x_22,local_444,local_448,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_,
                                  (ulong)(uint)ptrs * (ulong)ptrs._4_4_ * (ulong)res._width);
              *puVar8 = uVar1;
              local_58 = local_58 + 1;
            }
          }
        }
      }
    }
    puVar8 = cimg_library::CImg::operator_cast_to_unsigned_int_((CImg *)&ptrs);
    if (puVar8 == (uint *)0x0) {
      this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
      uVar1 = this->_width;
      uVar2 = this->_height;
      uVar3 = this->_depth;
      uVar4 = this->_spectrum;
      puVar8 = this->_data;
      pcVar9 = "non-";
      if ((this->_is_shared & 1U) != 0) {
        pcVar9 = "";
      }
      pcVar10 = pixel_type();
      CImgArgumentException::CImgArgumentException
                (this_00,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::permute_axes(): Invalid specified permutation \'%s\'."
                 ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar8,pcVar9,pcVar10,permut);
      __cxa_throw(this_00,&CImgArgumentException::typeinfo,
                  CImgArgumentException::~CImgArgumentException);
    }
    CImg(__return_storage_ptr__,(CImg<unsigned_int> *)&ptrs);
  }
LAB_0014ec4d:
  ~CImg((CImg<unsigned_int> *)&ptrs);
  return __return_storage_ptr__;
}

Assistant:

CImg<t> _get_permute_axes(const char *const permut, const t&) const {
      if (is_empty() || !permut) return CImg<t>(*this,false);
      CImg<t> res;
      const T* ptrs = _data;
      if (!cimg::strncasecmp(permut,"xyzc",4)) return +*this;
      if (!cimg::strncasecmp(permut,"xycz",4)) {
	res.assign(_width,_height,_spectrum,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(x,y,c,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"xzyc",4)) {
	res.assign(_width,_depth,_height,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(x,z,y,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"xzcy",4)) {
	res.assign(_width,_depth,_spectrum,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(x,z,c,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"xcyz",4)) {
	res.assign(_width,_spectrum,_height,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(x,c,y,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"xczy",4)) {
	res.assign(_width,_spectrum,_depth,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(x,c,z,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yxzc",4)) {
	res.assign(_height,_width,_depth,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(y,x,z,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yxcz",4)) {
	res.assign(_height,_width,_spectrum,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(y,x,c,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yzxc",4)) {
	res.assign(_height,_depth,_width,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(y,z,x,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yzcx",4)) {
	res.assign(_height,_depth,_spectrum,_width);
	switch (_width) {
	case 1 : {
	  t *ptr_r = res.data(0,0,0,0);
	  for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
	    *(ptr_r++) = (t)*(ptrs++);
	  }
	} break;
	case 2 : {
	  t *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1);
	  for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
	    *(ptr_r++) = (t)*(ptrs++); *(ptr_g++) = (t)*(ptrs++);
	  }
	} break;
	case 3 : { // Optimization for the classical conversion from interleaved RGB to planar RGB
	  t *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1), *ptr_b = res.data(0,0,0,2);
	  for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
	    *(ptr_r++) = (t)*(ptrs++); *(ptr_g++) = (t)*(ptrs++); *(ptr_b++) = (t)*(ptrs++);
	  }
	} break;
	case 4 : { // Optimization for the classical conversion from interleaved RGBA to planar RGBA
	  t *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1), *ptr_b = res.data(0,0,0,2), *ptr_a = res.data(0,0,0,3);
	  for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
	    *(ptr_r++) = (t)*(ptrs++); *(ptr_g++) = (t)*(ptrs++); *(ptr_b++) = (t)*(ptrs++); *(ptr_a++) = (t)*(ptrs++);
	  }
	} break;
	default : {
          const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	  cimg_forXYZC(*this,x,y,z,c) res(y,z,c,x,wh,whd) = *(ptrs++);
          return res;
	}
	}
      }
      if (!cimg::strncasecmp(permut,"ycxz",4)) {
	res.assign(_height,_spectrum,_width,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(y,c,x,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yczx",4)) {
	res.assign(_height,_spectrum,_depth,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(y,c,z,x,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zxyc",4)) {
	res.assign(_depth,_width,_height,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(z,x,y,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zxcy",4)) {
	res.assign(_depth,_width,_spectrum,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(z,x,c,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zyxc",4)) {
	res.assign(_depth,_height,_width,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(z,y,x,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zycx",4)) {
	res.assign(_depth,_height,_spectrum,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(z,y,c,x,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zcxy",4)) {
	res.assign(_depth,_spectrum,_width,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(z,c,x,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zcyx",4)) {
	res.assign(_depth,_spectrum,_height,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(z,c,y,x,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"cxyz",4)) {
	res.assign(_spectrum,_width,_height,_depth);
	switch (_spectrum) {
	case 1 : {
	  const T *ptr_r = data(0,0,0,0);
	  t *ptrd = res._data;
	  for (unsigned long siz = (unsigned long)_width*_height*_depth; siz; --siz) *(ptrd++) = (t)*(ptr_r++);
	} break;
	case 2 : {
	  const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1);
	  t *ptrd = res._data;
	  for (unsigned long siz = (unsigned long)_width*_height*_depth; siz; --siz) {
	    *(ptrd++) = (t)*(ptr_r++); *(ptrd++) = (t)*(ptr_g++);
	  }
	} break;
	case 3 : { // Optimization for the classical conversion from planar RGB to interleaved RGB
	  const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1), *ptr_b = data(0,0,0,2);
	  t *ptrd = res._data;
	  for (unsigned long siz = (unsigned long)_width*_height*_depth; siz; --siz) {
	    *(ptrd++) = (t)*(ptr_r++); *(ptrd++) = (t)*(ptr_g++); *(ptrd++) = (t)*(ptr_b++);
	  }
	} break;
	case 4 : { // Optimization for the classical conversion from planar RGBA to interleaved RGBA
	  const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1), *ptr_b = data(0,0,0,2), *ptr_a = data(0,0,0,3);
	  t *ptrd = res._data;
	  for (unsigned long siz = (unsigned long)_width*_height*_depth; siz; --siz) {
	    *(ptrd++) = (t)*(ptr_r++); *(ptrd++) = (t)*(ptr_g++); *(ptrd++) = (t)*(ptr_b++); *(ptrd++) = (t)*(ptr_a++);
	  }
	} break;
	default : {
          const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	  cimg_forXYZC(*this,x,y,z,c) res(c,x,y,z,wh,whd) = (t)*(ptrs++);
	}
	}
      }
      if (!cimg::strncasecmp(permut,"cxzy",4)) {
	res.assign(_spectrum,_width,_depth,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(c,x,z,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"cyxz",4)) {
	res.assign(_spectrum,_height,_width,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(c,y,x,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"cyzx",4)) {
	res.assign(_spectrum,_height,_depth,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(c,y,z,x,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"czxy",4)) {
	res.assign(_spectrum,_depth,_width,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(c,z,x,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"czyx",4)) {
	res.assign(_spectrum,_depth,_height,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
	cimg_forXYZC(*this,x,y,z,c) res(c,z,y,x,wh,whd) = (t)*(ptrs++);
      }
      if (!res)
        throw CImgArgumentException(_cimg_instance
                                    "permute_axes(): Invalid specified permutation '%s'.",
                                    cimg_instance,
                                    permut);
      return res;
    }